

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall
AllocatorTest_allocator_ref_Test::~AllocatorTest_allocator_ref_Test
          (AllocatorTest_allocator_ref_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AllocatorTest, allocator_ref) {
  StrictMock< mock_allocator<int> > alloc;
  typedef allocator_ref< mock_allocator<int> > test_allocator_ref;
  test_allocator_ref ref(&alloc);
  // Check if allocator_ref forwards to the underlying allocator.
  check_forwarding(alloc, ref);
  test_allocator_ref ref2(ref);
  check_forwarding(alloc, ref2);
  test_allocator_ref ref3;
  EXPECT_EQ(FMT_NULL, ref3.get());
  ref3 = ref;
  check_forwarding(alloc, ref3);
}